

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int as154x(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
          double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
          double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *pdVar7;
  double *pdVar8;
  reg_object obj;
  ulong uVar9;
  int *ipiv;
  ulong uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  int iVar14;
  undefined4 in_register_00000084;
  double *pdVar15;
  long lVar16;
  int N_00;
  undefined1 local_100 [8];
  custom_function as154_min;
  void *local_d8;
  int local_cc;
  int local_c8;
  int p_local;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  long local_a8;
  ulong local_a0;
  double *local_98;
  long local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  double *local_60;
  int local_54;
  uint local_50;
  char local_49;
  ulong local_48;
  double *local_40;
  xlik_object local_38;
  
  pdVar6 = phi;
  iVar11 = D;
  iVar4 = s;
  local_68 = CONCAT44(in_register_00000084,p);
  local_70 = (ulong)(uint)Q;
  local_a0 = (ulong)(uint)P;
  local_80 = (ulong)(uint)q;
  local_48 = 0;
  if (xreg != (double *)0x0) {
    local_48 = (ulong)(uint)r;
  }
  local_c0 = (double *)CONCAT44(local_c0._4_4_,optmethod);
  local_cc = p;
  local_54 = d;
  local_50 = N;
  local_40 = xreg;
  local_38 = (xlik_object)inp;
  if (cssml == 1) {
    iVar3 = cssx(inp,N,xreg,optmethod,p,d,q,s,P,D,Q,phi,theta,PHI,THETA,exog,r,wmean,var,loglik,hess
                 ,start,imean);
    if (iVar3 != 1) {
      return iVar3;
    }
    iVar3 = checkroots_cerr(pdVar6,&local_cc,theta,&q,PHI,&P,THETA,&Q);
    if (iVar3 == 10) {
      return 10;
    }
    if (iVar3 == 0xc) {
      return 0xc;
    }
  }
  else if (start == 0) {
    if (0 < p) {
      memset(phi,0,(ulong)(uint)p << 3);
    }
    if (0 < (int)local_80) {
      memset(theta,0,(local_80 & 0xffffffff) << 3);
    }
    if (0 < (int)local_a0) {
      memset(PHI,0,(local_a0 & 0xffffffff) << 3);
    }
    if (0 < (int)local_70) {
      memset(THETA,0,(local_70 & 0xffffffff) << 3);
    }
  }
  uVar5 = local_50;
  local_c8 = iVar11 * iVar4;
  local_90 = CONCAT44(local_90._4_4_,local_50 - local_c8);
  sVar13 = (long)(int)(local_50 - local_c8) << 3;
  pdVar6 = (double *)malloc(sVar13);
  uVar2 = local_50;
  iVar3 = local_54;
  if (iVar11 < 1) {
    uVar10 = (ulong)uVar5;
    if (0 < (int)uVar5) {
      memcpy(pdVar6,local_38,(ulong)local_50 << 3);
      uVar10 = (ulong)uVar2;
    }
  }
  else {
    iVar4 = diffs((double *)local_38,uVar5,iVar11,iVar4,pdVar6);
    uVar10 = CONCAT44(extraout_var,iVar4);
    iVar3 = local_54;
  }
  iVar4 = (int)uVar10;
  local_88 = sVar13;
  local_b0 = (double *)malloc((long)(iVar4 - iVar3) << 3);
  uVar5 = local_50;
  if (iVar3 < 1) {
    local_78 = uVar10;
    if (0 < iVar4) {
      memcpy(local_b0,pdVar6,(uVar10 & 0xffffffff) << 3);
    }
  }
  else {
    iVar4 = diff(pdVar6,iVar4,iVar3,local_b0);
    uVar5 = local_50;
    local_78 = CONCAT44(extraout_var_00,iVar4);
  }
  local_38 = (xlik_object)(long)(int)uVar5;
  iVar4 = r + 1;
  pdVar7 = (double *)malloc((long)local_38 * (long)iVar4 * 8);
  uVar10 = local_48;
  iVar11 = -D;
  local_49 = imean == 1 && iVar11 == iVar3;
  local_60 = (double *)CONCAT44(local_60._4_4_,iVar11);
  iVar14 = (int)local_48;
  if (imean == 1 && iVar11 == iVar3) {
    if (0 < (int)uVar5) {
      uVar10 = 0;
      do {
        pdVar7[uVar10] = 1.0;
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    if (0 < r) {
      memcpy(pdVar7 + (long)local_38,local_40,(ulong)(uint)r * (long)local_38 * 8);
    }
    uVar10 = (ulong)(iVar14 + 1);
  }
  else if (0 < iVar14) {
    memcpy(pdVar7,local_40,(local_48 & 0xffffffff) * (long)local_38 * 8);
  }
  local_40 = (double *)((long)(int)local_78 * 8);
  pdVar8 = (double *)malloc((long)iVar4 * (long)local_40);
  sVar13 = local_88;
  local_b8 = pdVar7;
  local_98 = pdVar8;
  local_48 = uVar10;
  if ((int)uVar10 < 1) {
    iVar4 = (int)local_68;
    iVar11 = (int)local_80;
    iVar14 = (int)local_a0;
  }
  else {
    if (0 < D) {
      uVar10 = uVar10 & 0xffffffff;
      local_38 = (xlik_object)((long)local_38 << 3);
      pdVar15 = pdVar7;
      do {
        diffs(pdVar7,local_50,D,s,pdVar8);
        memcpy(pdVar15,pdVar8,sVar13);
        pdVar8 = (double *)((long)pdVar8 + sVar13);
        pdVar15 = (double *)((long)pdVar15 + sVar13);
        pdVar7 = (double *)((long)pdVar7 + (long)local_38);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      iVar3 = local_54;
      uVar5 = (uint)local_90;
    }
    if (0 < iVar3) {
      uVar10 = 1;
      if (1 < (int)local_48) {
        uVar10 = local_48 & 0xffffffff;
      }
      local_38 = (xlik_object)((long)(int)uVar5 << 3);
      pdVar7 = local_b8;
      pdVar8 = local_98;
      do {
        diff(pdVar7,uVar5,iVar3,pdVar8);
        pdVar8 = (double *)((long)pdVar8 + (long)local_40);
        pdVar7 = (double *)((long)pdVar7 + (long)local_38);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    pdVar15 = local_40;
    uVar10 = local_48;
    pdVar8 = local_98;
    pdVar7 = local_b8;
    iVar4 = (int)local_48;
    if ((int)local_60 == iVar3) {
      memcpy(local_98,local_b8,(local_48 & 0xffffffff) * (long)local_40);
    }
    iVar3 = (int)local_78;
    iVar11 = rank(pdVar8,iVar3,iVar4);
    if (iVar11 < iVar4) {
      puts("Exogenous Variables are collinear. ");
      free(pdVar6);
      free(pdVar7);
      free(pdVar8);
      free(local_b0);
      return 7;
    }
    obj = reg_init(iVar3,iVar4);
    sVar13 = (uVar10 & 0xffffffff) * 8;
    local_38 = (xlik_object)malloc((uVar10 & 0xffffffff) * sVar13);
    local_40 = (double *)malloc((size_t)pdVar15);
    pdVar7 = (double *)malloc(sVar13);
    local_d8 = malloc(sVar13);
    lVar16 = 0;
    setIntercept(obj,0);
    regress(obj,local_98,local_b0,local_40,(double *)local_38,0.95);
    uVar9 = 1;
    if (1 < iVar4) {
      uVar9 = uVar10 & 0xffffffff;
    }
    do {
      *(undefined8 *)((long)pdVar7 + lVar16) =
           *(undefined8 *)((long)&obj->beta[0].value + lVar16 * 4);
      *(double *)((long)local_d8 + lVar16) =
           *(double *)((long)&obj->beta[0].stdErr + lVar16 * 4) * 10.0;
      lVar16 = lVar16 + 8;
    } while (uVar9 * 8 != lVar16);
    free(local_38);
    free(local_40);
    free_reg(obj);
    iVar4 = (int)local_68;
    iVar11 = (int)local_80;
    iVar14 = (int)local_a0;
    iVar3 = local_54;
  }
  N_00 = (int)local_78;
  local_38 = xlik_init(iVar4,iVar3,iVar11,s,iVar14,D,(int)local_70,(int)uVar10,N_00);
  local_a8 = (long)local_38->offset;
  local_38->N = N_00;
  local_38->M = (int)uVar10;
  local_38->mean = *wmean;
  lVar16 = (long)local_38->pq;
  sVar13 = lVar16 * 8;
  pdVar8 = (double *)malloc(sVar13);
  local_40 = (double *)malloc(sVar13);
  pdVar15 = (double *)malloc(sVar13 * lVar16);
  as154_min.params = malloc(sVar13);
  local_88 = lVar16;
  ipiv = (int *)malloc(lVar16 * 4);
  iVar4 = (int)local_68;
  if (0 < iVar4) {
    memcpy(pdVar8,phi,(local_68 & 0xffffffff) << 3);
    iVar4 = (int)local_68;
  }
  local_90 = (long)iVar4;
  iVar3 = (int)local_80;
  iVar11 = (int)local_c0;
  if (0 < iVar3) {
    uVar10 = 0;
    do {
      pdVar8[local_90 + uVar10] = -theta[uVar10];
      uVar10 = uVar10 + 1;
    } while ((local_80 & 0xffffffff) != uVar10);
  }
  iVar14 = (int)local_a0;
  if (0 < iVar14) {
    uVar10 = 0;
    do {
      pdVar8[(long)(iVar3 + iVar4) + uVar10] = PHI[uVar10];
      uVar10 = uVar10 + 1;
    } while ((local_a0 & 0xffffffff) != uVar10);
  }
  if (0 < (int)local_70) {
    uVar10 = 0;
    do {
      pdVar8[(long)(iVar3 + iVar4 + iVar14) + uVar10] = -THETA[uVar10];
      uVar10 = uVar10 + 1;
    } while ((local_70 & 0xffffffff) != uVar10);
  }
  if (0 < (int)local_48) {
    uVar10 = 0;
    do {
      pdVar8[(long)(iVar3 + iVar4 + iVar14 + (int)local_70) + uVar10] = pdVar7[uVar10];
      uVar10 = uVar10 + 1;
    } while ((local_48 & 0xffffffff) != uVar10);
  }
  local_38->mean = 0.0;
  iVar4 = (int)local_78;
  uVar10 = local_78 & 0xffffffff;
  if (0 < iVar4) {
    uVar9 = 0;
    do {
      dVar1 = local_b0[uVar9];
      local_38->x[(long)((int)local_a8 + iVar4 * 2) + uVar9] = dVar1;
      local_38->x[local_a8 + uVar9] = dVar1;
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  local_60 = pdVar8;
  if (iVar4 < iVar4 * 2) {
    memset(local_38->x + ((int)local_a8 + iVar4),0,(ulong)(iVar4 - 1) * 8 + 8);
    iVar4 = (int)local_78;
  }
  iVar3 = (int)local_48;
  if ((0 < iVar3) && (iVar4 * 3 < (iVar3 + 3) * iVar4)) {
    memcpy(local_38->x + (iVar4 * 3 + (int)local_a8),local_98,(ulong)(iVar4 * iVar3 - 1) * 8 + 8);
  }
  local_100 = (undefined1  [8])fas154x_seas;
  as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)local_38;
  p_local = fminunc((custom_function *)local_100,(custom_gradient *)0x0,(int)local_88,local_60,1.0,
                    iVar11,local_40);
  if ((0xf < (uint)p_local) || ((0x8011U >> (p_local & 0x1fU) & 1) == 0)) {
    p_local = 1;
  }
  iVar4 = (int)local_80;
  if (0 < iVar4) {
    invertroot(iVar4,local_40 + local_90);
    iVar4 = (int)local_80;
  }
  if (0 < (int)local_70) {
    invertroot((int)local_70,local_40 + local_90 + (long)iVar4 + (long)(int)local_a0);
  }
  pdVar8 = hess;
  iVar4 = (int)local_88;
  uVar5 = iVar4 - (int)local_48;
  if (uVar5 != 0 && (int)local_48 <= iVar4) {
    uVar9 = 0;
    do {
      *(undefined8 *)((long)as154_min.params + uVar9 * 8) = 0x3ff0000000000000;
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  if (0 < (int)local_48) {
    uVar9 = 0;
    do {
      *(undefined8 *)((long)as154_min.params + uVar9 * 8 + (long)(int)uVar5 * 8) =
           *(undefined8 *)((long)local_d8 + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while ((local_48 & 0xffffffff) != uVar9);
  }
  local_c0 = pdVar7;
  hessian_fd((custom_function *)local_100,local_40,iVar4,(double *)as154_min.params,local_38->eps,
             hess);
  mtranspose(pdVar8,iVar4,iVar4,pdVar15);
  iVar11 = (int)local_88;
  if (iVar4 != 0) {
    uVar9 = 0;
    do {
      pdVar15[uVar9] =
           (pdVar8[uVar9] + pdVar15[uVar9]) * (double)(int)(local_50 - (local_c8 + local_54)) * 0.5;
      uVar9 = uVar9 + 1;
    } while (iVar11 * iVar11 + (uint)(iVar11 * iVar11 == 0) != uVar9);
  }
  ludecomp(pdVar15,iVar11,ipiv);
  minverse(pdVar15,iVar11,ipiv,pdVar8);
  iVar4 = (int)local_68;
  if (0 < iVar4) {
    memcpy(phi,local_40,(local_68 & 0xffffffff) << 3);
    iVar4 = (int)local_68;
  }
  pdVar7 = local_c0;
  iVar11 = (int)local_80;
  if (0 < iVar11) {
    uVar9 = 0;
    do {
      theta[uVar9] = -local_40[local_90 + uVar9];
      uVar9 = uVar9 + 1;
    } while ((local_80 & 0xffffffff) != uVar9);
  }
  iVar3 = (int)local_a0;
  if (0 < iVar3) {
    uVar9 = 0;
    do {
      PHI[uVar9] = local_40[(long)(iVar11 + iVar4) + uVar9];
      uVar9 = uVar9 + 1;
    } while ((local_a0 & 0xffffffff) != uVar9);
  }
  iVar14 = (int)local_70;
  if (0 < iVar14) {
    uVar9 = 0;
    do {
      THETA[uVar9] = -local_40[(long)(iVar11 + iVar4 + iVar3) + uVar9];
      uVar9 = uVar9 + 1;
    } while ((local_70 & 0xffffffff) != uVar9);
  }
  if (local_49 == '\0') {
    *wmean = 0.0;
    if (0 < (int)local_48) {
      uVar9 = 0;
      do {
        exog[uVar9] = local_40[(long)(iVar11 + iVar4 + iVar3 + iVar14) + uVar9];
        uVar9 = uVar9 + 1;
      } while ((local_48 & 0xffffffff) != uVar9);
    }
  }
  else {
    lVar16 = (long)(iVar11 + iVar4 + iVar3 + iVar14);
    *wmean = local_40[lVar16];
    if (1 < (int)local_48) {
      lVar12 = 0;
      do {
        exog[lVar12] = local_40[lVar16 + lVar12 + 1];
        lVar12 = lVar12 + 1;
      } while ((local_48 & 0xffffffff) - 1 != lVar12);
    }
  }
  iVar4 = (int)local_78;
  *var = local_38->ssq / (double)iVar4;
  if (0 < iVar4) {
    uVar9 = 0;
    do {
      resid[uVar9] = local_38->x[(long)((int)local_a8 + iVar4) + uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
  }
  *loglik = local_38->loglik;
  free(local_60);
  free(local_40);
  free(local_b0);
  free(pdVar15);
  free(ipiv);
  free(as154_min.params);
  free(pdVar6);
  free(local_b8);
  free(local_98);
  if (0 < (int)local_48) {
    free(pdVar7);
    free(local_d8);
  }
  free(local_38);
  return p_local;
}

Assistant:

int as154x(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q, double *phi, double *theta, 
 	double *PHI, double *THETA, double *exog, int r, double *wmean, double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean) {
	int i,pq,retval,length,ret,ncxreg,nd,offset,N1,rnk,orig,ERR;
	double *b,*tf,*x,*dx,*thess,*XX,*varcovar,*res,*x0,*inp2,*U,*V,*SIG,*coeff,*sigma;
	int *ipiv;
	double maxstep;
	xlik_object obj;
	reg_object fit;

	length = N;// length of xreg as x is differenced first
	
	maxstep = 1.0;
	ncxreg = (xreg == NULL) ? 0 : r;
	nd = d + D;

	if (cssml == 1) {
		ERR = cssx(inp, N, xreg, optmethod, p, d, q, s, P, D, Q, phi, theta, PHI, THETA,exog,r, wmean, var, loglik, hess,start,imean);

		if ( ERR != 1) return ERR;

		ERR = checkroots_cerr(phi, &p, theta, &q, PHI, &P, THETA, &Q);
		if (ERR == 10 || ERR == 12) return ERR;
	}
	else {

		if (start == 0) {
			for (i = 0; i < p; ++i) phi[i] = 0.0;
			for (i = 0; i < q; ++i) theta[i] = 0.0;
			for (i = 0; i < P; ++i) PHI[i] = 0.0;
			for (i = 0; i < Q; ++i) THETA[i] = 0.0;
		}
	}

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	//mdisplay(x,1,N);

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);

		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
			//printf("coeff %g sigma %g ",coeff[i],sigma[i]);
		}

		free(varcovar);
		free(res);
		free_reg(fit);
	}

	
 
	obj = xlik_init(p,d,q,s,P,D,Q,ncxreg,N);


	offset = obj->offset;

	obj->N = N;
	obj->M = ncxreg;
	obj->mean = *wmean;
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);


	// Initialize Parameters

	//mdisplay(theta,1,q);
	//mdisplay(THETA,1,Q);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	}

	


	obj->mean = 0.0;

	// Set data vector

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}

	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}


	custom_function as154_min = { fas154x_seas, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	if (q > 0) {
		invertroot(q,tf+p);
	}

	if (Q > 0) {
		invertroot(Q,tf+p+q+P);
	}



	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}

	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);
	

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}
	

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}


	*var = (obj->ssq) / (double) N;

	for (i = 0; i < N; ++i) {
		resid[i] = obj->x[offset + N + i];
	}
	*loglik = obj->loglik;

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free(inp2);
	free(x0);
	free(XX); 
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	
	free_xlik(obj);
	return ret;
}